

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

void __thiscall
SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::RemoveCurrent
          (EditingIterator *this,ArenaAllocator *allocator)

{
  NodeBase *pNVar1;
  long *plVar2;
  long extraout_RDX;
  code *local_48;
  FreeFuncType freeFunc;
  NodeBase *dead;
  ArenaAllocator *allocator_local;
  EditingIterator *this_local;
  
  pNVar1 = (this->super_Iterator).current;
  UnlinkCurrent(this);
  local_48 = (code *)Memory::TypeAllocatorFunc<Memory::ArenaAllocator,_FlowEdge_*>::GetFreeFunc();
  plVar2 = (long *)((long)&(allocator->
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>)
                           .super_Allocator.outOfMemoryFunc + extraout_RDX);
  if (((ulong)local_48 & 1) != 0) {
    local_48 = *(code **)(local_48 + *plVar2 + -1);
  }
  (*local_48)(plVar2,pNVar1,0x10);
  return;
}

Assistant:

void RemoveCurrent(TAllocator * allocator)
        {
            const NodeBase *dead = this->current;
            UnlinkCurrent();

            auto freeFunc = TypeAllocatorFunc<TAllocator, TData>::GetFreeFunc();

            AllocatorFree(allocator, freeFunc, (Node *) dead, sizeof(Node));
        }